

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsyncLogging.cpp
# Opt level: O1

void __thiscall AsyncLogging::threadFunc(AsyncLogging *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  pointer psVar2;
  pointer psVar3;
  char *logline;
  FixedBuffer<4000000> *pFVar4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  const_iterator __cbeg;
  ulong uVar6;
  MutexLockGuard lock;
  ulong uVar7;
  long lVar8;
  pointer psVar9;
  BufferVector buffersToWrite;
  BufferPtr newBuffer2;
  BufferPtr newBuffer1;
  LogFile output;
  vector<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
  local_c8;
  FixedBuffer<4000000> *local_a8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_a0;
  FixedBuffer<4000000> *local_98;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_90 [2];
  Condition *local_80;
  BufferPtr *local_78;
  BufferVector *local_70;
  LogFile local_68;
  
  if (this->running_ == false) {
    __assert_fail("running_",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ruanyvan[P]WebServer/WebServer/base/AsyncLogging.cpp"
                  ,0x30,"void AsyncLogging::threadFunc()");
  }
  CountDownLatch::countDown(&this->latch_);
  LogFile::LogFile(&local_68,&this->basename_,0x400);
  local_98 = (FixedBuffer<4000000> *)operator_new(0x3d0908);
  local_98->cur_ = (char *)local_98;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<FixedBuffer<4000000>*>
            (a_Stack_90,local_98);
  local_a8 = (FixedBuffer<4000000> *)operator_new(0x3d0908);
  local_a8->cur_ = (char *)local_a8;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<FixedBuffer<4000000>*>
            (&_Stack_a0,local_a8);
  memset(local_98,0,4000000);
  memset(local_a8,0,4000000);
  local_c8.
  super__Vector_base<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_c8.
  super__Vector_base<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_c8.
  super__Vector_base<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
  ::reserve(&local_c8,0x10);
  local_70 = &this->buffers_;
  local_80 = &this->cond_;
  local_78 = &this->currentBuffer_;
  while( true ) {
    if (this->running_ != true) {
      LogFile::flush(&local_68);
      std::
      vector<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
      ::~vector(&local_c8);
      if (_Stack_a0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_a0._M_pi);
      }
      if (a_Stack_90[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_90[0]._M_pi);
      }
      LogFile::~LogFile(&local_68);
      return;
    }
    if ((local_98 == (FixedBuffer<4000000> *)0x0) || (*(int *)&local_98->cur_ != (int)local_98)) {
      __assert_fail("newBuffer1 && newBuffer1->length()==0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/ruanyvan[P]WebServer/WebServer/base/AsyncLogging.cpp"
                    ,0x3a,"void AsyncLogging::threadFunc()");
    }
    if ((local_a8 == (FixedBuffer<4000000> *)0x0) || (*(int *)&local_a8->cur_ != (int)local_a8)) {
      __assert_fail("newBuffer2 && newBuffer2->length()==0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/ruanyvan[P]WebServer/WebServer/base/AsyncLogging.cpp"
                    ,0x3b,"void AsyncLogging::threadFunc()");
    }
    if (local_c8.
        super__Vector_base<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_c8.
        super__Vector_base<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      __assert_fail("buffersToWrite.empty()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/ruanyvan[P]WebServer/WebServer/base/AsyncLogging.cpp"
                    ,0x3c,"void AsyncLogging::threadFunc()");
    }
    pthread_mutex_lock((pthread_mutex_t *)&this->mutex_);
    if ((this->buffers_).
        super__Vector_base<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        (this->buffers_).
        super__Vector_base<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      Condition::waitForSeconds(local_80,this->flushInterval_);
    }
    std::
    vector<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
    ::push_back(local_70,local_78);
    p_Var1 = (this->currentBuffer_).
             super___shared_ptr<FixedBuffer<4000000>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    (this->currentBuffer_).super___shared_ptr<FixedBuffer<4000000>,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)0x0;
    (this->currentBuffer_).super___shared_ptr<FixedBuffer<4000000>,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
    }
    _Var5._M_pi = a_Stack_90[0]._M_pi;
    pFVar4 = local_98;
    local_98 = (FixedBuffer<4000000> *)0x0;
    a_Stack_90[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    p_Var1 = (this->currentBuffer_).
             super___shared_ptr<FixedBuffer<4000000>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    (this->currentBuffer_).super___shared_ptr<FixedBuffer<4000000>,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = pFVar4;
    (this->currentBuffer_).super___shared_ptr<FixedBuffer<4000000>,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = _Var5._M_pi;
    if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
    }
    _Var5._M_pi = _Stack_a0._M_pi;
    pFVar4 = local_a8;
    psVar2 = (this->buffers_).
             super__Vector_base<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    psVar3 = (this->buffers_).
             super__Vector_base<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    psVar9 = (this->buffers_).
             super__Vector_base<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (this->buffers_).
    super__Vector_base<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         local_c8.
         super__Vector_base<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    (this->buffers_).
    super__Vector_base<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         local_c8.
         super__Vector_base<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    (this->buffers_).
    super__Vector_base<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         local_c8.
         super__Vector_base<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_c8.
    super__Vector_base<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = psVar2;
    local_c8.
    super__Vector_base<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = psVar3;
    local_c8.
    super__Vector_base<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = psVar9;
    if ((this->nextBuffer_).super___shared_ptr<FixedBuffer<4000000>,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr == (element_type *)0x0) {
      local_a8 = (FixedBuffer<4000000> *)0x0;
      _Stack_a0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      p_Var1 = (this->nextBuffer_).
               super___shared_ptr<FixedBuffer<4000000>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi;
      (this->nextBuffer_).super___shared_ptr<FixedBuffer<4000000>,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = pFVar4;
      (this->nextBuffer_).super___shared_ptr<FixedBuffer<4000000>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = _Var5._M_pi;
      if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
      }
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->mutex_);
    if (local_c8.
        super__Vector_base<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        local_c8.
        super__Vector_base<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) break;
    if (400 < (ulong)((long)local_c8.
                            super__Vector_base<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)local_c8.
                           super__Vector_base<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)) {
      std::
      vector<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
      ::_M_erase(&local_c8,
                 local_c8.
                 super__Vector_base<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + 2,
                 (shared_ptr<FixedBuffer<4000000>_> *)
                 (((long)local_c8.
                         super__Vector_base<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                  (long)local_c8.
                        super__Vector_base<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start) +
                 (long)local_c8.
                       super__Vector_base<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start));
    }
    if (local_c8.
        super__Vector_base<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish ==
        local_c8.
        super__Vector_base<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      uVar6 = 0;
    }
    else {
      lVar8 = 0;
      uVar7 = 0;
      do {
        logline = *(char **)((long)&((local_c8.
                                      super__Vector_base<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->
                                    super___shared_ptr<FixedBuffer<4000000>,_(__gnu_cxx::_Lock_policy)2>
                                    )._M_ptr + lVar8);
        LogFile::append(&local_68,logline,*(int *)(logline + 4000000) - (int)logline);
        uVar7 = uVar7 + 1;
        uVar6 = (long)local_c8.
                      super__Vector_base<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)local_c8.
                      super__Vector_base<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 4;
        lVar8 = lVar8 + 0x10;
      } while (uVar7 < uVar6);
    }
    if (2 < uVar6) {
      std::
      vector<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
      ::resize(&local_c8,2);
    }
    if (local_98 == (FixedBuffer<4000000> *)0x0) {
      if (local_c8.
          super__Vector_base<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          local_c8.
          super__Vector_base<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        __assert_fail("!buffersToWrite.empty()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/ruanyvan[P]WebServer/WebServer/base/AsyncLogging.cpp"
                      ,0x5c,"void AsyncLogging::threadFunc()");
      }
      local_98 = local_c8.
                 super__Vector_base<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish[-1].
                 super___shared_ptr<FixedBuffer<4000000>,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                (a_Stack_90,
                 &local_c8.
                  super__Vector_base<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish[-1].
                  super___shared_ptr<FixedBuffer<4000000>,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      psVar2 = local_c8.
               super__Vector_base<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish + -1;
      p_Var1 = local_c8.
               super__Vector_base<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish[-1].
               super___shared_ptr<FixedBuffer<4000000>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi;
      local_c8.
      super__Vector_base<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = psVar2;
      if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
      }
      local_98->cur_ = local_98->data_;
    }
    if (local_a8 == (FixedBuffer<4000000> *)0x0) {
      if (local_c8.
          super__Vector_base<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          local_c8.
          super__Vector_base<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        __assert_fail("!buffersToWrite.empty()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/ruanyvan[P]WebServer/WebServer/base/AsyncLogging.cpp"
                      ,99,"void AsyncLogging::threadFunc()");
      }
      local_a8 = local_c8.
                 super__Vector_base<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish[-1].
                 super___shared_ptr<FixedBuffer<4000000>,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                (&_Stack_a0,
                 &local_c8.
                  super__Vector_base<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish[-1].
                  super___shared_ptr<FixedBuffer<4000000>,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      psVar2 = local_c8.
               super__Vector_base<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish + -1;
      p_Var1 = local_c8.
               super__Vector_base<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish[-1].
               super___shared_ptr<FixedBuffer<4000000>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi;
      local_c8.
      super__Vector_base<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = psVar2;
      if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
      }
      local_a8->cur_ = local_a8->data_;
    }
    psVar3 = local_c8.
             super__Vector_base<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    psVar2 = local_c8.
             super__Vector_base<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    psVar9 = local_c8.
             super__Vector_base<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (local_c8.
        super__Vector_base<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        local_c8.
        super__Vector_base<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      do {
        p_Var1 = (psVar9->super___shared_ptr<FixedBuffer<4000000>,_(__gnu_cxx::_Lock_policy)2>).
                 _M_refcount._M_pi;
        if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
        }
        psVar9 = psVar9 + 1;
      } while (psVar9 != psVar3);
      local_c8.
      super__Vector_base<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = psVar2;
    }
    LogFile::flush(&local_68);
  }
  __assert_fail("!buffersToWrite.empty()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ruanyvan[P]WebServer/WebServer/base/AsyncLogging.cpp"
                ,0x4d,"void AsyncLogging::threadFunc()");
}

Assistant:

void AsyncLogging::threadFunc(){
    assert(running_);
    latch_.countDown();
    LogFile output(basename_);
    BufferPtr newBuffer1(new Buffer);
    BufferPtr newBuffer2(new Buffer);
    newBuffer1->bzero();
    newBuffer2->bzero();
    BufferVector buffersToWrite;
    buffersToWrite.reserve(16);
    while (running_) {
        assert(newBuffer1 && newBuffer1->length()==0);
        assert(newBuffer2 && newBuffer2->length()==0);
        assert(buffersToWrite.empty());
        {
            MutexLockGuard lock(mutex_);
            if (buffers_.empty())
            {
                cond_.waitForSeconds(flushInterval_);
            }
            buffers_.push_back(currentBuffer_);
            currentBuffer_.reset();

            currentBuffer_ = std::move(newBuffer1);
            buffersToWrite.swap(buffers_);
            if(!nextBuffer_){
                nextBuffer_ = std::move(newBuffer2);
            }
        }

        assert(!buffersToWrite.empty());

        if(buffersToWrite.size() >25){
            buffersToWrite.erase(buffersToWrite.begin()+2, buffersToWrite.end());
        }

        for (size_t i=0; i<buffersToWrite.size(); ++i) {
            output.append(buffersToWrite[i]->data(), buffersToWrite[i]->length());
        }

        if(buffersToWrite.size() > 2){
            buffersToWrite.resize(2);
        }

        if(!newBuffer1){
            assert(!buffersToWrite.empty());
            newBuffer1 = buffersToWrite.back();
            buffersToWrite.pop_back();
            newBuffer1->reset();
        }

        if(!newBuffer2){
            assert(!buffersToWrite.empty());
            newBuffer2 = buffersToWrite.back();
            buffersToWrite.pop_back();
            newBuffer2->reset();
        }

        buffersToWrite.clear();
        output.flush();
    }
    output.flush();
}